

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O2

void __thiscall
mjs::bound_function_args::bound_function_args
          (bound_function_args *this,gc_heap *h,
          vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *v;
  pointer pvVar1;
  gc_vector<mjs::value_representation> *pgVar2;
  long lVar3;
  uint32_t i;
  ulong uVar4;
  gc_vector<mjs::value_representation> a;
  value_representation local_38;
  
  this->heap_ = h;
  value_representation::value_representation(&this->bound_this_,(value *)&value::undefined);
  (this->bound_args_).pos_ = 0;
  v = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start;
  if (v != (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish) {
    value_representation::value_representation((value_representation *)&a,v);
    (this->bound_this_).repr_ = (uint64_t)a.heap_;
    lVar3 = 0x28;
    if (1 < (ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                          _M_impl.super__Vector_impl_data._M_start) / 0x28)) {
      gc_vector<mjs::value_representation>::make((gc_heap *)&a,(uint32_t)this->heap_);
      (this->bound_args_).pos_ = a.table_.pos_;
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&a);
      pgVar2 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::value_representation>,_true>::dereference
                         (&this->bound_args_,this->heap_);
      a.heap_ = pgVar2->heap_;
      a.table_.pos_ = (pgVar2->table_).pos_;
      a._12_4_ = *(undefined4 *)&pgVar2->field_0xc;
      for (uVar4 = 1;
          pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                   super__Vector_impl_data._M_start,
          uVar4 < (((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x28 &
                  0xffffffffU); uVar4 = uVar4 + 1) {
        value_representation::value_representation
                  (&local_38,(value *)((long)&pvVar1->type_ + lVar3));
        gc_vector<mjs::value_representation>::push_back(&a,&local_38);
        lVar3 = lVar3 + 0x28;
      }
    }
  }
  return;
}

Assistant:

explicit bound_function_args(gc_heap& h, const std::vector<value>& args)
        : heap_{h}
        , bound_this_{value::undefined}
        , bound_args_{nullptr} {
        if (!args.empty()) {
            bound_this_ = value_representation{args[0]};
            if (args.size() > 1) {
                bound_args_ =  gc_vector<value_representation>::make(heap_, static_cast<uint32_t>(args.size() - 1));
                auto a = bound_args_.dereference(heap_);
                for (uint32_t i = 1; i < static_cast<uint32_t>(args.size()); ++i) {
                    a.push_back(value_representation{args[i]});
                }
            }
        }
    }